

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

void ReleaseHull(PHullResult *result)

{
  if ((result->m_Indices).m_size != 0) {
    btAlignedObjectArray<unsigned_int>::clear(&result->m_Indices);
  }
  result->mVcount = 0;
  result->mIndexCount = 0;
  result->mVertices = (btVector3 *)0x0;
  return;
}

Assistant:

void ReleaseHull(PHullResult &result)
{
	if ( result.m_Indices.size() )
	{
		result.m_Indices.clear();
	}

	result.mVcount = 0;
	result.mIndexCount = 0;
	result.mVertices = 0;
}